

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context,sysbvm_tuple_t name)

{
  sysbvm_tuple_t type;
  sysbvm_tuple_t result;
  sysbvm_tuple_t name_local;
  sysbvm_context_t *context_local;
  
  type = sysbvm_type_createAnonymous(context);
  sysbvm_type_setName(type,name);
  return type;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context, sysbvm_tuple_t name)
{
    sysbvm_tuple_t result = sysbvm_type_createAnonymous(context);
    sysbvm_type_setName(result, name);
    return result;
}